

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O0

int SSL_CTX_set_signed_cert_timestamp_list(SSL_CTX *ctx,uint8_t *list,size_t list_len)

{
  bool bVar1;
  int iVar2;
  CRYPTO_BUFFER *__p;
  pointer pCVar3;
  pointer cred;
  pointer sct_list;
  bool local_35;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_28;
  UniquePtr<CRYPTO_BUFFER> buf;
  size_t list_len_local;
  uint8_t *list_local;
  SSL_CTX *ctx_local;
  
  buf._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)list_len;
  __p = CRYPTO_BUFFER_new(list,list_len,(CRYPTO_BUFFER_POOL *)0x0);
  std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
  unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter> *)&local_28,__p);
  bVar1 = std::operator!=(&local_28,(nullptr_t)0x0);
  local_35 = false;
  if (bVar1) {
    pCVar3 = std::unique_ptr<bssl::CERT,_bssl::internal::Deleter>::operator->(&ctx->cert);
    cred = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::get
                     (&pCVar3->legacy_credential);
    sct_list = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get(&local_28);
    iVar2 = SSL_CREDENTIAL_set1_signed_cert_timestamp_list(cred,sct_list);
    local_35 = iVar2 != 0;
  }
  std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
  return (uint)local_35;
}

Assistant:

int SSL_CTX_set_signed_cert_timestamp_list(SSL_CTX *ctx, const uint8_t *list,
                                           size_t list_len) {
  UniquePtr<CRYPTO_BUFFER> buf(CRYPTO_BUFFER_new(list, list_len, nullptr));
  return buf != nullptr && SSL_CREDENTIAL_set1_signed_cert_timestamp_list(
                               ctx->cert->legacy_credential.get(), buf.get());
}